

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O0

IOUAmount jbcoin::mulRatio(IOUAmount *amt,uint32_t num,uint32_t den,bool roundUp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  const_reference pvVar5;
  bool bVar6;
  IOUAmount IVar7;
  long local_198;
  undefined1 local_180 [8];
  IOUAmount result;
  int64_t mantissa;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  undefined1 local_148 [8];
  uint128_t sav;
  bool local_129;
  int mustShrink;
  bool hasRem;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  undefined1 local_108 [8];
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  addRem;
  int local_ec;
  int roomToGrow;
  int exponent;
  undefined1 local_d8 [8];
  uint128_t rem;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  low;
  long local_a0;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  undefined1 local_88 [8];
  uint128_t mul;
  uint128_t den128;
  long lStack_60;
  bool neg;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58 [2];
  anon_class_1_0_00000001 local_2a;
  byte local_29;
  uint32_t local_28;
  uint32_t uStack_24;
  bool roundUp_local;
  uint32_t den_local;
  uint32_t num_local;
  IOUAmount *amt_local;
  int local_10;
  
  local_29 = roundUp;
  local_28 = den;
  uStack_24 = num;
  _den_local = amt;
  if (den == 0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
  }
  if ((mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable == '\0') &&
     (iVar2 = __cxa_guard_acquire(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)
                                   ::powerTable), iVar2 != 0)) {
    mulRatio::anon_class_1_0_00000001::operator()(&mulRatio::powerTable,&local_2a);
    __cxa_atexit(std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::~vector,&mulRatio::powerTable,&__dso_handle);
    __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::
                         powerTable);
  }
  if ((mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)
                                   ::fl64), iVar2 != 0)) {
    lStack_60 = std::numeric_limits<long>::max();
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::number<long>(local_58,&stack0xffffffffffffffa0,(type *)0x0);
    mulRatio::fl64 =
         mulRatio::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)
                    &mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::log10Floor,
                    local_58);
    __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64);
  }
  iVar4 = IOUAmount::mantissa(_den_local);
  bVar6 = iVar4 < 0;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&mul.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8),&local_28,(type *)0x0);
  if (bVar6) {
    iVar4 = IOUAmount::mantissa(_den_local);
    local_198 = -iVar4;
  }
  else {
    local_198 = IOUAmount::mantissa(_den_local);
  }
  local_a0 = local_198;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<long>(&local_98,&local_a0,(type *)0x0);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<unsigned_int>
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&low.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8),&stack0xffffffffffffffdc,(type *)0x0);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_88,&local_98,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&low.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8));
  boost::multiprecision::operator/
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&rem.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8),
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_88,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&mul.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8));
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&roomToGrow,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&rem.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8),
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&mul.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8));
  boost::multiprecision::operator-
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_d8,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_88,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&roomToGrow);
  local_ec = IOUAmount::exponent(_den_local);
  bVar1 = boost::multiprecision::number::operator_cast_to_bool((number *)local_d8);
  iVar2 = mulRatio::fl64;
  if (bVar1) {
    iVar3 = mulRatio::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       &mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::log10Ceil
                       ,(uint128_t *)
                        ((long)&rem.m_backend.
                                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                .m_data + 8));
    iVar2 = iVar2 - iVar3;
    if (0 < iVar2) {
      local_ec = local_ec - iVar2;
      pvVar5 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[](&mulRatio::powerTable,(long)iVar2);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)&rem.m_backend.
                              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                              .m_data + 8),pvVar5);
      pvVar5 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[](&mulRatio::powerTable,(long)iVar2);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_d8,pvVar5);
    }
    boost::multiprecision::operator/
              ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_108,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d8,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)&mul.m_backend.
                          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                          .m_data + 8));
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)&rem.m_backend.
                            super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                            .m_data + 8),(self_type *)local_108);
    boost::multiprecision::operator*
              ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&mustShrink,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_108,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)&mul.m_backend.
                          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                          .m_data + 8));
    boost::multiprecision::operator-
              (&local_118,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d8,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&mustShrink);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator=((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_d8,&local_118);
  }
  local_129 = boost::multiprecision::number::operator_cast_to_bool((number *)local_d8);
  iVar2 = mulRatio::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     &mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::log10Ceil,
                     (uint128_t *)
                     ((long)&rem.m_backend.
                             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                             .m_data + 8));
  iVar2 = iVar2 - mulRatio::fl64;
  if (0 < iVar2) {
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::number((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_148,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)&rem.m_backend.
                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data + 8));
    local_ec = iVar2 + local_ec;
    pvVar5 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[](&mulRatio::powerTable,(long)iVar2);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator/=((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)&rem.m_backend.
                            super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                            .m_data + 8),pvVar5);
    if (!local_129) {
      pvVar5 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[](&mulRatio::powerTable,(long)iVar2);
      boost::multiprecision::operator*
                ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&mantissa,
                 (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)&rem.m_backend.
                            super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                            .m_data + 8),pvVar5);
      boost::multiprecision::operator-
                (&local_158,
                 (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_148,
                 (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&mantissa);
      local_129 = boost::multiprecision::number::operator_cast_to_bool((number *)&local_158);
    }
  }
  result._8_8_ = boost::multiprecision::
                 number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                 ::convert_to<long>((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)&rem.m_backend.
                                               super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                               .m_data + 8));
  if (bVar6) {
    result._8_8_ = -result._8_8_;
  }
  IOUAmount::IOUAmount((IOUAmount *)local_180,result._8_8_,local_ec);
  if (local_129 != false) {
    if (((local_29 & 1) != 0) && (!bVar6)) {
      bVar6 = IOUAmount::operator_cast_to_bool((IOUAmount *)local_180);
      if (bVar6) {
        iVar4 = IOUAmount::mantissa((IOUAmount *)local_180);
        iVar2 = IOUAmount::exponent((IOUAmount *)local_180);
        IOUAmount::IOUAmount((IOUAmount *)&amt_local,iVar4 + 1,iVar2);
      }
      else {
        IOUAmount::IOUAmount((IOUAmount *)&amt_local,1000000000000000,-0x60);
      }
      goto LAB_00306de7;
    }
    if (((local_29 & 1) == 0) && (bVar6)) {
      bVar6 = IOUAmount::operator_cast_to_bool((IOUAmount *)local_180);
      if (bVar6) {
        iVar4 = IOUAmount::mantissa((IOUAmount *)local_180);
        iVar2 = IOUAmount::exponent((IOUAmount *)local_180);
        IOUAmount::IOUAmount((IOUAmount *)&amt_local,iVar4 + -1,iVar2);
      }
      else {
        IOUAmount::IOUAmount((IOUAmount *)&amt_local,-1000000000000000,-0x60);
      }
      goto LAB_00306de7;
    }
  }
  amt_local = (IOUAmount *)local_180;
  local_10 = (int)result.mantissa_;
LAB_00306de7:
  IVar7.exponent_ = local_10;
  IVar7.mantissa_ = (int64_t)amt_local;
  IVar7._12_4_ = 0;
  return IVar7;
}

Assistant:

IOUAmount
mulRatio (
    IOUAmount const& amt,
    std::uint32_t num,
    std::uint32_t den,
    bool roundUp)
{
    using namespace boost::multiprecision;

    if (!den)
        Throw<std::runtime_error> ("division by zero");

    // A vector with the value 10^index for indexes from 0 to 29
    // The largest intermediate value we expect is 2^96, which
    // is less than 10^29
    static auto const powerTable = []
    {
        std::vector<uint128_t> result;
        result.reserve (30);  // 2^96 is largest intermediate result size
        uint128_t cur (1);
        for (int i = 0; i < 30; ++i)
        {
            result.push_back (cur);
            cur *= 10;
        };
        return result;
    }();

    // Return floor(log10(v))
    // Note: Returns -1 for v == 0
    static auto log10Floor = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        int index = std::distance (powerTable.begin (), l);
        // If we're not equal, subtract to get the floor
        if (*l != v)
            --index;
        return index;
    };

    // Return ceil(log10(v))
    static auto log10Ceil = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        return int(std::distance (powerTable.begin (), l));
    };

    static auto const fl64 =
        log10Floor (std::numeric_limits<std::int64_t>::max ());

    bool const neg = amt.mantissa () < 0;
    uint128_t const den128 (den);
    // a 32 value * a 64 bit value and stored in a 128 bit value. This will never overflow
    uint128_t const mul =
        uint128_t (neg ? -amt.mantissa () : amt.mantissa ()) * uint128_t (num);

    auto low = mul / den128;
    uint128_t rem (mul - low * den128);

    int exponent = amt.exponent ();

    if (rem)
    {
        // Mathematically, the result is low + rem/den128. However, since this
        // uses integer division rem/den128 will be zero. Scale the result so
        // low does not overflow the largest amount we can store in the mantissa
        // and (rem/den128) is as large as possible. Scale by multiplying low
        // and rem by 10 and subtracting one from the exponent. We could do this
        // with a loop, but it's more efficient to use logarithms.
        auto const roomToGrow = fl64 - log10Ceil (low);
        if (roomToGrow > 0)
        {
            exponent -= roomToGrow;
            low *= powerTable[roomToGrow];
            rem *= powerTable[roomToGrow];
        }
        auto const addRem = rem / den128;
        low += addRem;
        rem = rem - addRem * den128;
    }

    // The largest result we can have is ~2^95, which overflows the 64 bit
    // result we can store in the mantissa. Scale result down by dividing by ten
    // and adding one to the exponent until the low will fit in the 64-bit
    // mantissa. Use logarithms to avoid looping.
    bool hasRem = bool(rem);
    auto const mustShrink = log10Ceil (low) - fl64;
    if (mustShrink > 0)
    {
        uint128_t const sav (low);
        exponent += mustShrink;
        low /= powerTable[mustShrink];
        if (!hasRem)
            hasRem = bool(sav - low * powerTable[mustShrink]);
    }

    std::int64_t mantissa = low.convert_to<std::int64_t> ();

    // normalize before rounding
    if (neg)
        mantissa *= -1;

    IOUAmount result (mantissa, exponent);

    if (hasRem)
    {
        // handle rounding
        if (roundUp && !neg)
        {
            if (!result)
            {
                return IOUAmount (minMantissa, minExponent);
            }
            // This addition cannot overflow because the mantissa is already normalized
            return IOUAmount (result.mantissa () + 1, result.exponent ());
        }

        if (!roundUp && neg)
        {
            if (!result)
            {
                return IOUAmount (-minMantissa, minExponent);
            }
            // This subtraction cannot underflow because `result` is not zero
            return IOUAmount (result.mantissa () - 1, result.exponent ());
        }
    }

    return result;
}